

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O2

void __thiscall ON_LineCurve::Dump(ON_LineCurve *this,ON_TextLog *dump)

{
  double dVar1;
  double dVar2;
  
  dVar1 = ON_Interval::operator[](&this->m_t,0);
  dVar2 = ON_Interval::operator[](&this->m_t,1);
  ON_TextLog::Print(dump,"ON_LineCurve:  domain = [%g,%g]\n",dVar1,SUB84(dVar2,0));
  ON_TextLog::PushIndent(dump);
  ON_TextLog::Print(dump,"start = ");
  ON_TextLog::Print(dump,&(this->m_line).from);
  ON_TextLog::Print(dump,"\nend = ");
  ON_TextLog::Print(dump,&(this->m_line).to);
  ON_TextLog::Print(dump,"\n");
  ON_Line::Length(&this->m_line);
  ON_TextLog::Print(dump,"length = %g\n");
  ON_TextLog::PopIndent(dump);
  return;
}

Assistant:

void ON_LineCurve::Dump( ON_TextLog& dump ) const
{
  dump.Print( "ON_LineCurve:  domain = [%g,%g]\n",m_t[0],m_t[1]);
  dump.PushIndent();
  dump.Print( "start = ");
  dump.Print( m_line.from );
  dump.Print( "\nend = ");
  dump.Print( m_line.to );
  dump.Print( "\n");
  dump.Print( "length = %g\n",m_line.Length());
  dump.PopIndent();
}